

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraphBuilder.h
# Opt level: O1

void __thiscall
dg::llvmdg::LLVMDependenceGraphBuilder::LLVMDependenceGraphBuilder
          (LLVMDependenceGraphBuilder *this,Module *M,LLVMDependenceGraphOptions *opts)

{
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *pmVar1;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
  *this_00;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this_01;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this_02;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
  *this_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  bool bVar7;
  undefined2 uVar8;
  UndefinedFunsBehavior UVar9;
  LLVMPointerAnalysis *pta;
  LLVMDataDependenceAnalysis *this_04;
  LLVMControlDependenceAnalysis *this_05;
  LLVMDependenceGraph *this_06;
  ControlFlowGraph *this_07;
  Function *pFVar10;
  StringRef SVar11;
  LLVMDataDependenceAnalysisOptions local_130;
  LLVMControlDependenceAnalysisOptions local_90;
  
  this->_M = M;
  (this->_options).PTAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p =
       (pointer)&(this->_options).PTAOptions.super_LLVMAnalysisOptions.entryFunction.field_2;
  pcVar3 = (opts->PTAOptions).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_options,pcVar3,
             pcVar3 + (opts->PTAOptions).super_LLVMAnalysisOptions.entryFunction._M_string_length);
  (this->_options).PTAOptions.super_PointerAnalysisOptions.super_AnalysisOptions.fieldSensitivity.
  offset = (opts->PTAOptions).super_PointerAnalysisOptions.super_AnalysisOptions.fieldSensitivity.
           offset;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&(this->_options).PTAOptions.super_PointerAnalysisOptions.super_AnalysisOptions.
              allocationFunctions._M_t,
             &(opts->PTAOptions).super_PointerAnalysisOptions.super_AnalysisOptions.
              allocationFunctions._M_t);
  bVar7 = (opts->PTAOptions).super_PointerAnalysisOptions.invalidateNodes;
  uVar8 = *(undefined2 *)&(opts->PTAOptions).super_PointerAnalysisOptions.field_0x3a;
  uVar4 = *(undefined4 *)&(opts->PTAOptions).super_PointerAnalysisOptions.field_0x3c;
  sVar6 = (opts->PTAOptions).super_PointerAnalysisOptions.maxIterations;
  uVar5 = *(undefined4 *)((long)&(opts->PTAOptions).super_PointerAnalysisOptions.maxIterations + 4);
  (this->_options).PTAOptions.super_PointerAnalysisOptions.preprocessGeps =
       (opts->PTAOptions).super_PointerAnalysisOptions.preprocessGeps;
  (this->_options).PTAOptions.super_PointerAnalysisOptions.invalidateNodes = bVar7;
  *(undefined2 *)&(this->_options).PTAOptions.super_PointerAnalysisOptions.field_0x3a = uVar8;
  *(undefined4 *)&(this->_options).PTAOptions.super_PointerAnalysisOptions.field_0x3c = uVar4;
  *(int *)&(this->_options).PTAOptions.super_PointerAnalysisOptions.maxIterations = (int)sVar6;
  *(undefined4 *)((long)&(this->_options).PTAOptions.super_PointerAnalysisOptions.maxIterations + 4)
       = uVar5;
  (this->_options).PTAOptions.analysisType = (opts->PTAOptions).analysisType;
  (this->_options).PTAOptions.threads = (opts->PTAOptions).threads;
  (this->_options).DDAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p =
       (pointer)&(this->_options).DDAOptions.super_LLVMAnalysisOptions.entryFunction.field_2;
  pcVar3 = (opts->DDAOptions).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_options).DDAOptions,pcVar3,
             pcVar3 + (opts->DDAOptions).super_LLVMAnalysisOptions.entryFunction._M_string_length);
  (this->_options).DDAOptions.super_DataDependenceAnalysisOptions.super_AnalysisOptions.
  fieldSensitivity.offset =
       (opts->DDAOptions).super_DataDependenceAnalysisOptions.super_AnalysisOptions.fieldSensitivity
       .offset;
  pmVar1 = &(this->_options).DDAOptions.super_DataDependenceAnalysisOptions.super_AnalysisOptions.
            allocationFunctions;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&pmVar1->_M_t,
             &(opts->DDAOptions).super_DataDependenceAnalysisOptions.super_AnalysisOptions.
              allocationFunctions._M_t);
  (this->_options).DDAOptions.super_DataDependenceAnalysisOptions.fieldInsensitive =
       (opts->DDAOptions).super_DataDependenceAnalysisOptions.fieldInsensitive;
  UVar9 = (opts->DDAOptions).super_DataDependenceAnalysisOptions.undefinedFunsBehavior;
  (this->_options).DDAOptions.super_DataDependenceAnalysisOptions.analysisType =
       (opts->DDAOptions).super_DataDependenceAnalysisOptions.analysisType;
  (this->_options).DDAOptions.super_DataDependenceAnalysisOptions.undefinedFunsBehavior = UVar9;
  this_00 = &(this->_options).DDAOptions.super_DataDependenceAnalysisOptions.functionModels;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
  ::_Rb_tree(&this_00->_M_t,
             &(opts->DDAOptions).super_DataDependenceAnalysisOptions.functionModels._M_t);
  (this->_options).DDAOptions.threads = (opts->DDAOptions).threads;
  (this->_options).CDAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p =
       (pointer)&(this->_options).CDAOptions.super_LLVMAnalysisOptions.entryFunction.field_2;
  pcVar3 = (opts->CDAOptions).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_options).CDAOptions,pcVar3,
             pcVar3 + (opts->CDAOptions).super_LLVMAnalysisOptions.entryFunction._M_string_length);
  (this->_options).CDAOptions.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
  fieldSensitivity.offset =
       (opts->CDAOptions).super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
       fieldSensitivity.offset;
  this_01 = &(this->_options).CDAOptions.super_ControlDependenceAnalysisOptions.
             super_AnalysisOptions.allocationFunctions;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&this_01->_M_t,
             &(opts->CDAOptions).super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
              allocationFunctions._M_t);
  (this->_options).CDAOptions.super_ControlDependenceAnalysisOptions.interprocedural =
       (opts->CDAOptions).super_ControlDependenceAnalysisOptions.interprocedural;
  (this->_options).CDAOptions.super_ControlDependenceAnalysisOptions.algorithm =
       (opts->CDAOptions).super_ControlDependenceAnalysisOptions.algorithm;
  *(undefined2 *)&(this->_options).CDAOptions.super_ControlDependenceAnalysisOptions.field_0x3d =
       *(undefined2 *)&(opts->CDAOptions).super_ControlDependenceAnalysisOptions.field_0x3d;
  (this->_options).preserveDbg = opts->preserveDbg;
  bVar7 = opts->threads;
  (this->_options).verifyGraph = opts->verifyGraph;
  (this->_options).threads = bVar7;
  (this->_options).entryFunction._M_dataplus._M_p = (pointer)&(this->_options).entryFunction.field_2
  ;
  pcVar3 = (opts->entryFunction)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_options).entryFunction,pcVar3,
             pcVar3 + (opts->entryFunction)._M_string_length);
  pta = createPTA(this);
  (this->_PTA)._M_t.
  super___uniq_ptr_impl<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMPointerAnalysis_*,_std::default_delete<dg::LLVMPointerAnalysis>_>.
  super__Head_base<0UL,_dg::LLVMPointerAnalysis_*,_false>._M_head_impl = pta;
  this_04 = (LLVMDataDependenceAnalysis *)operator_new(0xc0);
  local_130.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p =
       (pointer)&local_130.super_LLVMAnalysisOptions.entryFunction.field_2;
  pcVar3 = (this->_options).DDAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar3,
             pcVar3 + (this->_options).DDAOptions.super_LLVMAnalysisOptions.entryFunction.
                      _M_string_length);
  local_130.super_DataDependenceAnalysisOptions.super_AnalysisOptions.fieldSensitivity.offset =
       (this->_options).DDAOptions.super_DataDependenceAnalysisOptions.super_AnalysisOptions.
       fieldSensitivity.offset;
  this_02 = &local_130.super_DataDependenceAnalysisOptions.super_AnalysisOptions.allocationFunctions
  ;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&this_02->_M_t,&pmVar1->_M_t);
  local_130.super_DataDependenceAnalysisOptions.fieldInsensitive =
       (this->_options).DDAOptions.super_DataDependenceAnalysisOptions.fieldInsensitive;
  local_130.super_DataDependenceAnalysisOptions.analysisType =
       (this->_options).DDAOptions.super_DataDependenceAnalysisOptions.analysisType;
  local_130.super_DataDependenceAnalysisOptions.undefinedFunsBehavior =
       (this->_options).DDAOptions.super_DataDependenceAnalysisOptions.undefinedFunsBehavior;
  this_03 = &local_130.super_DataDependenceAnalysisOptions.functionModels;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
  ::_Rb_tree(&this_03->_M_t,&this_00->_M_t);
  local_130.threads = (this->_options).DDAOptions.threads;
  dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis(this_04,M,pta,&local_130);
  (this->_DDA)._M_t.
  super___uniq_ptr_impl<dg::dda::LLVMDataDependenceAnalysis,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::dda::LLVMDataDependenceAnalysis_*,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
  .super__Head_base<0UL,_dg::dda::LLVMDataDependenceAnalysis_*,_false>._M_head_impl = this_04;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
  ::_M_erase(&this_03->_M_t,
             (_Link_type)
             local_130.super_DataDependenceAnalysisOptions.functionModels._M_t._M_impl.
             super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&this_02->_M_t,
             (_Link_type)
             local_130.super_DataDependenceAnalysisOptions.super_AnalysisOptions.allocationFunctions
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p !=
      &local_130.super_LLVMAnalysisOptions.entryFunction.field_2) {
    operator_delete(local_130.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,
                    local_130.super_LLVMAnalysisOptions.entryFunction.field_2._M_allocated_capacity
                    + 1);
  }
  this_05 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
  paVar2 = &local_90.super_LLVMAnalysisOptions.entryFunction.field_2;
  pcVar3 = (this->_options).CDAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p;
  local_90.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,
             pcVar3 + (this->_options).CDAOptions.super_LLVMAnalysisOptions.entryFunction.
                      _M_string_length);
  local_90.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.fieldSensitivity.offset =
       (this->_options).CDAOptions.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
       fieldSensitivity.offset;
  pmVar1 = &local_90.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
            allocationFunctions;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&pmVar1->_M_t,&this_01->_M_t);
  local_90.super_ControlDependenceAnalysisOptions.interprocedural =
       (this->_options).CDAOptions.super_ControlDependenceAnalysisOptions.interprocedural;
  local_90.super_ControlDependenceAnalysisOptions.algorithm =
       (this->_options).CDAOptions.super_ControlDependenceAnalysisOptions.algorithm;
  local_90.super_ControlDependenceAnalysisOptions._61_2_ =
       *(undefined2 *)&(this->_options).CDAOptions.super_ControlDependenceAnalysisOptions.field_0x3d
  ;
  LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
            (this_05,M,&local_90,(LLVMPointerAnalysis *)0x0);
  (this->_CDA)._M_t.
  super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
  .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl = this_05;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&pmVar1->_M_t,
             (_Link_type)
             local_90.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
             allocationFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,
                    local_90.super_LLVMAnalysisOptions.entryFunction.field_2._M_allocated_capacity +
                    1);
  }
  this_06 = (LLVMDependenceGraph *)operator_new(0x158);
  LLVMDependenceGraph::LLVMDependenceGraph(this_06,opts->threads);
  (this->_dg)._M_t.
  super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>.
  super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl = this_06;
  this_07 = (ControlFlowGraph *)0x0;
  if (((this->_options).threads == true) && ((this->_options).PTAOptions.analysisType != svf)) {
    this_07 = (ControlFlowGraph *)operator_new(0x18);
    ControlFlowGraph::ControlFlowGraph
              (this_07,(DGLLVMPointerAnalysis *)
                       (this->_PTA)._M_t.
                       super___uniq_ptr_impl<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_dg::LLVMPointerAnalysis_*,_std::default_delete<dg::LLVMPointerAnalysis>_>
                       .super__Head_base<0UL,_dg::LLVMPointerAnalysis_*,_false>._M_head_impl);
  }
  (this->_controlFlowGraph)._M_t.
  super___uniq_ptr_impl<ControlFlowGraph,_std::default_delete<ControlFlowGraph>_>._M_t.
  super__Tuple_impl<0UL,_ControlFlowGraph_*,_std::default_delete<ControlFlowGraph>_>.
  super__Head_base<0UL,_ControlFlowGraph_*,_false>._M_head_impl = this_07;
  SVar11.Length = (size_t)(this->_options).entryFunction._M_dataplus._M_p;
  SVar11.Data = (char *)M;
  pFVar10 = (Function *)llvm::Module::getFunction(SVar11);
  this->_entryFunction = pFVar10;
  (this->_statistics).cdaTime = 0;
  (this->_statistics).ptaTime = 0;
  (this->_statistics).rdaTime = 0;
  (this->_statistics).inferaTime = 0;
  (this->_statistics).joinsTime = 0;
  (this->_statistics).critsecTime = 0;
  return;
}

Assistant:

LLVMDependenceGraphBuilder(llvm::Module *M,
                               const LLVMDependenceGraphOptions &opts)
            : _M(M), _options(opts), _PTA(createPTA()),
              _DDA(new LLVMDataDependenceAnalysis(M, _PTA.get(),
                                                  _options.DDAOptions)),
              _CDA(new LLVMControlDependenceAnalysis(M, _options.CDAOptions)),
              _dg(new LLVMDependenceGraph(opts.threads)),
              _controlFlowGraph(
                      _options.threads && !_options.PTAOptions.isSVF()
                              ? // check SVF due to the static cast...
                              new ControlFlowGraph(
                                      static_cast<DGLLVMPointerAnalysis *>(
                                              _PTA.get()))
                              : nullptr),
              _entryFunction(M->getFunction(_options.entryFunction)) {
        assert(_entryFunction && "The entry function not found");
    }